

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.cpp
# Opt level: O3

void __thiscall embree::BVHNStatistics<8>::BVHNStatistics(BVHNStatistics<8> *this,BVH *bvh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  LeafStat statLeaf;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_> statAABBNodes;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<8>,_8>_> statOBBNodes;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<8>,_8>_> statAABBNodesMB;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>_> statAABBNodesMB4D;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<8>,_8>_> statOBBNodesMB;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<8>,_8>_> statQuantizedNodes;
  undefined1 auVar5 [16];
  LeafStat local_1a0;
  Statistics local_130;
  
  *(BVH **)this = bvh;
  Statistics::LeafStat::LeafStat(&local_1a0,0.0,0,0,0,0,0);
  statLeaf.numLeaves = local_1a0.numLeaves;
  statLeaf.leafSAH = local_1a0.leafSAH;
  statLeaf.numPrimsActive = local_1a0.numPrimsActive;
  statLeaf.numPrimsTotal = local_1a0.numPrimsTotal;
  statLeaf.numPrimBlocks = local_1a0.numPrimBlocks;
  statLeaf.numBytes = local_1a0.numBytes;
  statLeaf.numPrimBlocksHistogram[0] = local_1a0.numPrimBlocksHistogram[0];
  statLeaf.numPrimBlocksHistogram[1] = local_1a0.numPrimBlocksHistogram[1];
  statLeaf.numPrimBlocksHistogram[2] = local_1a0.numPrimBlocksHistogram[2];
  statLeaf.numPrimBlocksHistogram[3] = local_1a0.numPrimBlocksHistogram[3];
  statLeaf.numPrimBlocksHistogram[4] = local_1a0.numPrimBlocksHistogram[4];
  statLeaf.numPrimBlocksHistogram[5] = local_1a0.numPrimBlocksHistogram[5];
  statLeaf.numPrimBlocksHistogram[6] = local_1a0.numPrimBlocksHistogram[6];
  statLeaf.numPrimBlocksHistogram[7] = local_1a0.numPrimBlocksHistogram[7];
  statAABBNodes.numChildren = 0;
  statAABBNodes.nodeSAH = 0.0;
  statAABBNodes.numNodes = 0;
  statOBBNodes.numChildren = 0;
  statOBBNodes.nodeSAH = 0.0;
  statOBBNodes.numNodes = 0;
  statAABBNodesMB.numChildren = 0;
  statAABBNodesMB.nodeSAH = 0.0;
  statAABBNodesMB.numNodes = 0;
  statAABBNodesMB4D.numChildren = 0;
  statAABBNodesMB4D.nodeSAH = 0.0;
  statAABBNodesMB4D.numNodes = 0;
  statOBBNodesMB.numChildren = 0;
  statOBBNodesMB.nodeSAH = 0.0;
  statOBBNodesMB.numNodes = 0;
  statQuantizedNodes.numChildren = 0;
  statQuantizedNodes.nodeSAH = 0.0;
  statQuantizedNodes.numNodes = 0;
  Statistics::Statistics
            ((Statistics *)(this + 8),0,statLeaf,statAABBNodes,statOBBNodes,statAABBNodesMB,
             statAABBNodesMB4D,statOBBNodesMB,statQuantizedNodes);
  auVar3 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds0.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds0.lower.field_0);
  auVar4 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds1.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds1.lower.field_0);
  auVar1 = vblendps_avx(auVar3,ZEXT816(0) << 0x40,8);
  auVar2 = vshufps_avx(auVar1,auVar1,0xc9);
  auVar4 = vblendps_avx(auVar4,ZEXT816(0) << 0x40,8);
  auVar5 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar1 = vsubps_avx(auVar4,auVar1);
  auVar4 = vsubps_avx(auVar5,auVar2);
  auVar5._0_4_ = auVar1._0_4_ * auVar4._0_4_ * 0.33333334 +
                 auVar3._0_4_ * auVar2._0_4_ +
                 (auVar3._0_4_ * auVar4._0_4_ + auVar2._0_4_ * auVar1._0_4_) * 0.5;
  auVar5._4_4_ = auVar1._4_4_ * auVar4._4_4_ * 0.33333334 +
                 auVar3._4_4_ * auVar2._4_4_ +
                 (auVar3._4_4_ * auVar4._4_4_ + auVar2._4_4_ * auVar1._4_4_) * 0.5;
  auVar5._8_4_ = auVar1._8_4_ * auVar4._8_4_ * 0.33333334 +
                 auVar3._8_4_ * auVar2._8_4_ +
                 (auVar3._8_4_ * auVar4._8_4_ + auVar2._8_4_ * auVar1._8_4_) * 0.5;
  auVar5._12_4_ =
       auVar1._12_4_ * auVar4._12_4_ * 0.33333334 +
       auVar3._12_4_ * auVar2._12_4_ +
       (auVar3._12_4_ * auVar4._12_4_ + auVar2._12_4_ * auVar1._12_4_) * 0.5;
  auVar1 = vhaddps_avx(auVar5,auVar5);
  auVar4 = vshufpd_avx(auVar5,auVar5,1);
  auVar1 = vmaxss_avx(ZEXT416((uint)(auVar4._0_4_ + auVar1._0_4_)),ZEXT816(0) << 0x20);
  statistics(&local_130,this,(NodeRef)(bvh->root).ptr,(double)auVar1._0_4_,
             (BBox1f)0x3f80000000000000);
  memcpy((Statistics *)(this + 8),&local_130,0x108);
  return;
}

Assistant:

BVHNStatistics<N>::BVHNStatistics (BVH* bvh) : bvh(bvh)
  {
    double A = max(0.0f,bvh->getLinearBounds().expectedHalfArea());
    stat = statistics(bvh->root,A,BBox1f(0.0f,1.0f));
  }